

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LoopLayerParams::SerializeWithCachedSizes
          (LoopLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int size;
  uint64 uVar2;
  long lVar3;
  char *data;
  string *value;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  LoopLayerParams *this_local;
  
  uVar2 = maxloopiterations(this);
  if (uVar2 != 0) {
    uVar2 = maxloopiterations(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar2,output);
  }
  conditionvar_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    conditionvar_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    conditionvar_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.LoopLayerParams.conditionVar");
    value = conditionvar_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(2,value,output);
  }
  bVar1 = has_conditionnetwork(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->conditionnetwork_->super_MessageLite,output);
  }
  bVar1 = has_bodynetwork(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&this->bodynetwork_->super_MessageLite,output);
  }
  return;
}

Assistant:

void LoopLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LoopLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 maxLoopIterations = 1;
  if (this->maxloopiterations() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->maxloopiterations(), output);
  }

  // string conditionVar = 2;
  if (this->conditionvar().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->conditionvar().data(), this->conditionvar().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.LoopLayerParams.conditionVar");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->conditionvar(), output);
  }

  // .CoreML.Specification.NeuralNetwork conditionNetwork = 3;
  if (this->has_conditionnetwork()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->conditionnetwork_, output);
  }

  // .CoreML.Specification.NeuralNetwork bodyNetwork = 4;
  if (this->has_bodynetwork()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *this->bodynetwork_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LoopLayerParams)
}